

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q1c_vector_op.cpp
# Opt level: O3

int main(void)

{
  long lVar1;
  iterator iVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  iterator iVar6;
  int *piVar7;
  ulong uVar8;
  bool bVar9;
  int i;
  vector<int,_std::allocator<int>_> v;
  string s;
  int local_7c;
  int *local_78;
  iterator iStack_70;
  int *local_68;
  int local_54;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  std::istream::operator>>((istream *)&std::cin,&local_54);
  local_78 = (int *)0x0;
  iStack_70._M_current = (int *)0x0;
  local_68 = (int *)0x0;
  bVar9 = local_54 != 0;
  local_54 = local_54 + -1;
  if (bVar9) {
    do {
      local_48 = 0;
      local_40 = 0;
      local_50 = &local_40;
      std::operator>>((istream *)&std::cin,(string *)&local_50);
      iVar3 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar3 == 0) {
        std::istream::operator>>((istream *)&std::cin,&local_7c);
        if (iStack_70._M_current == local_68) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_78,iStack_70,&local_7c);
        }
        else {
          *iStack_70._M_current = local_7c;
          iStack_70._M_current = iStack_70._M_current + 1;
        }
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_50);
        iVar2._M_current = iStack_70._M_current;
        piVar7 = local_78;
        if (iVar3 == 0) {
          if (local_78 != iStack_70._M_current) {
            uVar5 = (long)iStack_70._M_current - (long)local_78 >> 2;
            lVar1 = 0x3f;
            if (uVar5 != 0) {
              for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_78,iStack_70._M_current,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (piVar7,iVar2._M_current);
          }
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_50);
          iVar2._M_current = iStack_70._M_current;
          piVar7 = local_78;
          if (iVar3 == 0) {
            iVar6._M_current = local_78;
            if (local_78 != iStack_70._M_current) {
              uVar5 = (long)iStack_70._M_current - (long)local_78 >> 2;
              lVar1 = 0x3f;
              if (uVar5 != 0) {
                for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_78,iStack_70._M_current,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (piVar7,iVar2._M_current);
              iVar6._M_current = iStack_70._M_current;
            }
            uVar5 = (long)iVar6._M_current - (long)local_78 >> 2;
            if (1 < uVar5) {
              piVar7 = (int *)(((long)iVar6._M_current - (long)local_78) + (long)local_78);
              uVar8 = 0;
              do {
                piVar7 = piVar7 + -1;
                iVar3 = local_78[uVar8];
                local_78[uVar8] = *piVar7;
                *piVar7 = iVar3;
                uVar8 = uVar8 + 1;
              } while (uVar5 >> 1 != uVar8);
            }
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_50);
            if (iVar3 == 0) {
              uVar5 = (long)iStack_70._M_current - (long)local_78 >> 2;
              if (1 < uVar5) {
                piVar7 = (int *)(((long)iStack_70._M_current - (long)local_78) + (long)local_78);
                uVar8 = 0;
                do {
                  piVar7 = piVar7 + -1;
                  iVar3 = local_78[uVar8];
                  local_78[uVar8] = *piVar7;
                  *piVar7 = iVar3;
                  uVar8 = uVar8 + 1;
                } while (uVar5 >> 1 != uVar8);
              }
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&local_50);
              if (iVar3 == 0) {
                std::istream::operator>>((istream *)&std::cin,&local_7c);
                piVar7 = local_78 + (long)local_7c + 1;
                if (piVar7 != iStack_70._M_current) {
                  memmove(local_78 + local_7c,piVar7,(long)iStack_70._M_current - (long)piVar7);
                }
                iStack_70._M_current = iStack_70._M_current + -1;
              }
            }
          }
        }
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      iVar2._M_current = iStack_70._M_current;
      bVar9 = local_54 != 0;
      local_54 = local_54 + -1;
      piVar7 = local_78;
    } while (bVar9);
    for (; piVar7 != iVar2._M_current; piVar7 = piVar7 + 1) {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  if (local_78 != (int *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  return 0;
}

Assistant:

int main() {
    int round;
    cin >> round;
    vector<int> v;
    while (round--) {
        string s;
        cin >> s;

        if (s == "pb") {
            int x;
            cin >> x;
            v.push_back(x);
        } else if (s == "sa") {
            sort(v.begin(), v.end());
        } else if (s == "sd") {
            sort(v.begin(), v.end());
            reverse(v);
        } else if (s == "r") {
            reverse(v);
        } else if (s == "d") {
            int i;
            cin >> i;
            v.erase(v.begin() + i);
        }
    }
    for (auto e : v) {
        cout << e << " ";
    }
    cout << "\n";
}